

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O0

bool __thiscall ObjectFile::commitTransaction(ObjectFile *this)

{
  MutexLocker *in_RDI;
  MutexLocker lock;
  bool in_stack_000000af;
  ObjectFile *in_stack_000000b0;
  Mutex *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  bool local_1;
  
  MutexLocker::MutexLocker(in_RDI,in_stack_ffffffffffffffb8);
  if (((ulong)in_RDI[8]._vptr_MutexLocker & 1) == 0) {
    local_1 = false;
  }
  else if (in_RDI[8].mutex == (Mutex *)0x0) {
    softHSMLog(3,"commitTransaction",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x326,"Transaction lock file instance invalid!");
    local_1 = false;
  }
  else {
    store(in_stack_000000b0,in_stack_000000af);
    if (((ulong)in_RDI[6].mutex & 1) == 0) {
      local_1 = false;
    }
    else {
      File::unlock((File *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      if (in_RDI[8].mutex != (Mutex *)0x0) {
        (*(in_RDI[8].mutex)->_vptr_Mutex[1])();
      }
      in_RDI[8].mutex = (Mutex *)0x0;
      *(undefined1 *)&in_RDI[8]._vptr_MutexLocker = 0;
      local_1 = true;
    }
  }
  MutexLocker::~MutexLocker(in_RDI);
  return local_1;
}

Assistant:

bool ObjectFile::commitTransaction()
{
	MutexLocker lock(objectMutex);

	if (!inTransaction)
	{
		return false;
	}

	if (transactionLockFile == NULL)
	{
		ERROR_MSG("Transaction lock file instance invalid!");

		return false;
	}

	// Special store case
	store(true);

	if (!valid)
	{
		return false;
	}

	transactionLockFile->unlock();

	delete transactionLockFile;
	transactionLockFile = NULL;
	inTransaction = false;

	return true;
}